

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMatrixAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_3::TypedAttribute<Imath_3_1::Matrix33<double>_>::writeValueTo
          (TypedAttribute<Imath_3_1::Matrix33<double>_> *this,OStream *os,int version)

{
  OStream *in_RSI;
  long in_RDI;
  double in_stack_ffffffffffffffa8;
  OStream *v;
  OStream *in_stack_ffffffffffffffb0;
  
  Imath_3_1::Matrix33<double>::operator[]((Matrix33<double> *)(in_RDI + 8),0);
  Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Imath_3_1::Matrix33<double>::operator[]((Matrix33<double> *)(in_RDI + 8),0);
  Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  v = in_RSI;
  Imath_3_1::Matrix33<double>::operator[]((Matrix33<double> *)(in_RDI + 8),0);
  Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>(in_stack_ffffffffffffffb0,(double)v);
  Imath_3_1::Matrix33<double>::operator[]((Matrix33<double> *)(in_RDI + 8),1);
  Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>(in_RSI,(double)v);
  Imath_3_1::Matrix33<double>::operator[]((Matrix33<double> *)(in_RDI + 8),1);
  Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>(in_RSI,(double)v);
  Imath_3_1::Matrix33<double>::operator[]((Matrix33<double> *)(in_RDI + 8),1);
  Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>(in_RSI,(double)v);
  Imath_3_1::Matrix33<double>::operator[]((Matrix33<double> *)(in_RDI + 8),2);
  Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>(in_RSI,(double)v);
  Imath_3_1::Matrix33<double>::operator[]((Matrix33<double> *)(in_RDI + 8),2);
  Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>(in_RSI,(double)v);
  Imath_3_1::Matrix33<double>::operator[]((Matrix33<double> *)(in_RDI + 8),2);
  Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>(in_RSI,(double)v);
  return;
}

Assistant:

IMF_EXPORT void
M33dAttribute::writeValueTo (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, int version) const
{
    Xdr::write<StreamIO> (os, _value[0][0]);
    Xdr::write<StreamIO> (os, _value[0][1]);
    Xdr::write<StreamIO> (os, _value[0][2]);

    Xdr::write<StreamIO> (os, _value[1][0]);
    Xdr::write<StreamIO> (os, _value[1][1]);
    Xdr::write<StreamIO> (os, _value[1][2]);

    Xdr::write<StreamIO> (os, _value[2][0]);
    Xdr::write<StreamIO> (os, _value[2][1]);
    Xdr::write<StreamIO> (os, _value[2][2]);
}